

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

bool __thiscall Glucose::reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Clause *pCVar4;
  float *pfVar5;
  Ref in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float fVar6;
  bool local_1;
  
  pCVar4 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  iVar1 = Clause::size(pCVar4);
  if (2 < iVar1) {
    pCVar4 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    iVar1 = Clause::size(pCVar4);
    if (iVar1 == 2) {
      return true;
    }
  }
  pCVar4 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  iVar1 = Clause::size(pCVar4);
  if (2 < iVar1) {
    pCVar4 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    iVar1 = Clause::size(pCVar4);
    if (iVar1 == 2) {
      return false;
    }
  }
  pCVar4 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  iVar1 = Clause::size(pCVar4);
  if (iVar1 == 2) {
    pCVar4 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    iVar1 = Clause::size(pCVar4);
    if (iVar1 == 2) {
      return false;
    }
  }
  pCVar4 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  uVar2 = Clause::lbd(pCVar4);
  pCVar4 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  uVar3 = Clause::lbd(pCVar4);
  if (uVar3 < uVar2) {
    local_1 = true;
  }
  else {
    pCVar4 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    uVar2 = Clause::lbd(pCVar4);
    pCVar4 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    uVar3 = Clause::lbd(pCVar4);
    if (uVar2 < uVar3) {
      local_1 = false;
    }
    else {
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      pfVar5 = Clause::activity(pCVar4);
      fVar6 = *pfVar5;
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)CONCAT44(fVar6,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      pfVar5 = Clause::activity(pCVar4);
      local_1 = fVar6 < *pfVar5;
    }
  }
  return local_1;
}

Assistant:

bool operator()(CRef x, CRef y) {

        // Main criteria... Like in MiniSat we keep all binary clauses
        if (ca[x].size() > 2 && ca[y].size() == 2) return 1;

        if (ca[y].size() > 2 && ca[x].size() == 2) return 0;
        if (ca[x].size() == 2 && ca[y].size() == 2) return 0;

        // Second one  based on literal block distance
        if (ca[x].lbd() > ca[y].lbd()) return 1;
        if (ca[x].lbd() < ca[y].lbd()) return 0;


        // Finally we can use old activity or size, we choose the last one
        return ca[x].activity() < ca[y].activity();
        //return x->size() < y->size();

        //return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); } 
    }